

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# allocators.hh
# Opt level: O0

void __thiscall
tchecker::syncprod::details::
state_pool_allocator_t<tchecker::make_shared_t<tchecker::zg::state_t,_unsigned_long,_1UL>_>::
state_pool_allocator_t
          (state_pool_allocator_t<tchecker::make_shared_t<tchecker::zg::state_t,_unsigned_long,_1UL>_>
           *this,size_t state_alloc_nb,size_t vloc_alloc_nb,size_t vloc_capacity,size_t table_size)

{
  size_t alloc_nb;
  size_t alloc_size;
  periodic_collectable_cache_t<tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::vloc_t,_unsigned_long,_1UL>_>,_tchecker::intrusive_shared_ptr_delegate_hash_t,_tchecker::intrusive_shared_ptr_delegate_equal_to_t>
  *this_00;
  shared_ptr<tchecker::collectable_t> local_50 [2];
  size_t local_30;
  size_t table_size_local;
  size_t vloc_capacity_local;
  size_t vloc_alloc_nb_local;
  size_t state_alloc_nb_local;
  state_pool_allocator_t<tchecker::make_shared_t<tchecker::zg::state_t,_unsigned_long,_1UL>_>
  *this_local;
  
  local_30 = table_size;
  table_size_local = vloc_capacity;
  vloc_capacity_local = vloc_alloc_nb;
  vloc_alloc_nb_local = state_alloc_nb;
  state_alloc_nb_local = (size_t)this;
  tchecker::ts::
  state_pool_allocator_t<tchecker::make_shared_t<tchecker::zg::state_t,_unsigned_long,_1UL>_>::
  state_pool_allocator_t
            (&this->
              super_state_pool_allocator_t<tchecker::make_shared_t<tchecker::zg::state_t,_unsigned_long,_1UL>_>
             ,state_alloc_nb);
  alloc_nb = vloc_capacity_local;
  this->_vloc_capacity = table_size_local;
  alloc_size = allocation_size_t<tchecker::make_shared_t<tchecker::vloc_t,unsigned_long,1ul>>::
               alloc_size<unsigned_long&>(&this->_vloc_capacity);
  pool_t<tchecker::make_shared_t<tchecker::vloc_t,_unsigned_long,_1UL>_>::pool_t
            (&this->_vloc_pool,alloc_nb,alloc_size);
  this_00 = (periodic_collectable_cache_t<tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::vloc_t,_unsigned_long,_1UL>_>,_tchecker::intrusive_shared_ptr_delegate_hash_t,_tchecker::intrusive_shared_ptr_delegate_equal_to_t>
             *)operator_new(0x58);
  periodic_collectable_cache_t<tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::vloc_t,_unsigned_long,_1UL>_>,_tchecker::intrusive_shared_ptr_delegate_hash_t,_tchecker::intrusive_shared_ptr_delegate_equal_to_t>
  ::periodic_collectable_cache_t(this_00,local_30);
  std::
  shared_ptr<tchecker::periodic_collectable_cache_t<tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::vloc_t,unsigned_long,1ul>>,tchecker::intrusive_shared_ptr_delegate_hash_t,tchecker::intrusive_shared_ptr_delegate_equal_to_t>>
  ::
  shared_ptr<tchecker::periodic_collectable_cache_t<tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::vloc_t,unsigned_long,1ul>>,tchecker::intrusive_shared_ptr_delegate_hash_t,tchecker::intrusive_shared_ptr_delegate_equal_to_t>,void>
            ((shared_ptr<tchecker::periodic_collectable_cache_t<tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::vloc_t,unsigned_long,1ul>>,tchecker::intrusive_shared_ptr_delegate_hash_t,tchecker::intrusive_shared_ptr_delegate_equal_to_t>>
              *)&this->_vloc_cache,this_00);
  std::shared_ptr<tchecker::collectable_t>::
  shared_ptr<tchecker::periodic_collectable_cache_t<tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::vloc_t,unsigned_long,1ul>>,tchecker::intrusive_shared_ptr_delegate_hash_t,tchecker::intrusive_shared_ptr_delegate_equal_to_t>,void>
            (local_50,&this->_vloc_cache);
  pool_t<tchecker::make_shared_t<tchecker::vloc_t,_unsigned_long,_1UL>_>::enroll
            (&this->_vloc_pool,local_50);
  std::shared_ptr<tchecker::collectable_t>::~shared_ptr(local_50);
  return;
}

Assistant:

state_pool_allocator_t(std::size_t state_alloc_nb, std::size_t vloc_alloc_nb, std::size_t vloc_capacity,
                         std::size_t table_size)
      : tchecker::ts::state_pool_allocator_t<STATE>(state_alloc_nb), _vloc_capacity(vloc_capacity),
        _vloc_pool(vloc_alloc_nb, tchecker::allocation_size_t<tchecker::shared_vloc_t>::alloc_size(_vloc_capacity)),
        _vloc_cache(new vloc_cache_t(table_size))

  {
    _vloc_pool.enroll(_vloc_cache);
  }